

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O1

void pzshape::TPZShapeTetra::SideShape
               (int side,TPZVec<double> *point,TPZVec<long> *id,TPZVec<int> *order,
               TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  if (0xf < (uint)side) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZCompElT3d::SideShapeFunction. Bad paramenter side.\n",0x36)
    ;
    return;
  }
  if (side == 0xe) {
    Shape(point,id,order,phi,dphi);
    return;
  }
  if (side < 4) {
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    *phi->fElem = 1.0;
  }
  else {
    if (side < 10) {
      TPZShapeLinear::Shape(point,id,order,phi,dphi);
      return;
    }
    if (side < 0xe) {
      TPZShapeTriang::Shape(point,id,order,phi,dphi);
      return;
    }
  }
  return;
}

Assistant:

void TPZShapeTetra::SideShape(int side, TPZVec<REAL> &point, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		if(side<0 || side>15) PZError << "TPZCompElT3d::SideShapeFunction. Bad paramenter side.\n";
		else if(side==14) Shape(point,id,order,phi,dphi);
		else if(side<4) phi(0,0)=1.;
		else if(side<10) {//4 a 9
			TPZShapeLinear::Shape(point,id,order,phi,dphi);
		}
		else if(side<14) {//faces 10,11,12,13
			TPZShapeTriang::Shape(point,id,order,phi,dphi);
		}
		
	}